

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O3

void gflags::anon_unknown_5::Test_SetFlagValueTest_OrdinaryValues::Run(void)

{
  int iVar1;
  char *pcVar2;
  FlagSettingMode in_R8D;
  FlagSettingMode FVar3;
  char *pcVar4;
  FlagSaver fs;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","SetFlagValueTest","OrdinaryValues");
  iVar1 = std::__cxx11::string::compare(fLS::FLAGS_test_str1_abi_cxx11_);
  if (iVar1 == 0) {
    SetCommandLineOptionWithMode_abi_cxx11_
              (&local_28,(gflags *)0x14f46f,"second",(char *)0x1,in_R8D);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p);
    }
    iVar1 = std::__cxx11::string::compare(fLS::FLAGS_test_str1_abi_cxx11_);
    if (iVar1 == 0) {
      SetCommandLineOptionWithMode_abi_cxx11_
                (&local_48,(gflags *)0x14f46f,"third",(char *)0x1,in_R8D);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      iVar1 = std::__cxx11::string::compare(fLS::FLAGS_test_str1_abi_cxx11_);
      if (iVar1 == 0) {
        FVar3 = 7;
        std::__cxx11::string::_M_replace
                  ((ulong)fLS::FLAGS_test_str1_abi_cxx11_,0,
                   *(char **)(fLS::FLAGS_test_str1_abi_cxx11_ + 8),0x14817b);
        SetCommandLineOptionWithMode_abi_cxx11_
                  (&local_68,(gflags *)0x14f46f,"third",(char *)0x1,FVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        iVar1 = std::__cxx11::string::compare(fLS::FLAGS_test_str1_abi_cxx11_);
        if (iVar1 != 0) goto LAB_00120a9d;
        SetCommandLineOptionWithMode_abi_cxx11_
                  (&local_88,(gflags *)0x14f46f,"third",(char *)0x0,FVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
        iVar1 = std::__cxx11::string::compare(fLS::FLAGS_test_str1_abi_cxx11_);
        if (iVar1 == 0) {
          SetCommandLineOptionWithMode_abi_cxx11_
                    (&local_a8,(gflags *)0x14f46f,"fourth",(char *)0x2,FVar3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
          iVar1 = std::__cxx11::string::compare(fLS::FLAGS_test_str1_abi_cxx11_);
          if (iVar1 == 0) {
            iVar1 = std::__cxx11::string::compare(fLS::FLAGS_test_str2_abi_cxx11_);
            if (iVar1 == 0) {
              SetCommandLineOptionWithMode_abi_cxx11_
                        (&local_c8,(gflags *)0x14f4a4,"second",(char *)0x2,FVar3);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p);
              }
              iVar1 = std::__cxx11::string::compare(fLS::FLAGS_test_str2_abi_cxx11_);
              if (iVar1 == 0) {
                std::__cxx11::string::_M_replace
                          ((ulong)fLS::FLAGS_test_str2_abi_cxx11_,0,
                           *(char **)(fLS::FLAGS_test_str2_abi_cxx11_ + 8),0x14f4ae);
                iVar1 = std::__cxx11::string::compare(fLS::FLAGS_test_str2_abi_cxx11_);
                if (iVar1 == 0) {
                  FVar3 = 6;
                  std::__cxx11::string::_M_replace
                            ((ulong)fLS::FLAGS_test_str2_abi_cxx11_,0,
                             *(char **)(fLS::FLAGS_test_str2_abi_cxx11_ + 8),0x14f479);
                  SetCommandLineOptionWithMode_abi_cxx11_
                            (&local_e8,(gflags *)0x14f4a4,"third",(char *)0x2,FVar3);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                    operator_delete(local_e8._M_dataplus._M_p);
                  }
                  iVar1 = std::__cxx11::string::compare(fLS::FLAGS_test_str2_abi_cxx11_);
                  if (iVar1 == 0) {
                    SetCommandLineOptionWithMode_abi_cxx11_
                              (&local_108,(gflags *)0x14f4a4,"fourth",(char *)0x1,FVar3);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_108._M_dataplus._M_p != &local_108.field_2) {
                      operator_delete(local_108._M_dataplus._M_p);
                    }
                    iVar1 = std::__cxx11::string::compare(fLS::FLAGS_test_str2_abi_cxx11_);
                    if (iVar1 == 0) {
                      iVar1 = std::__cxx11::string::compare(fLS::FLAGS_test_str3_abi_cxx11_);
                      if (iVar1 == 0) {
                        SetCommandLineOptionWithMode_abi_cxx11_
                                  (&local_128,(gflags *)0x14f4cb,"second",(char *)0x2,FVar3);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_128._M_dataplus._M_p != &local_128.field_2) {
                          operator_delete(local_128._M_dataplus._M_p);
                        }
                        iVar1 = std::__cxx11::string::compare(fLS::FLAGS_test_str3_abi_cxx11_);
                        if (iVar1 == 0) {
                          FVar3 = 5;
                          std::__cxx11::string::_M_replace
                                    ((ulong)fLS::FLAGS_test_str3_abi_cxx11_,0,
                                     *(char **)(fLS::FLAGS_test_str3_abi_cxx11_ + 8),0x14f489);
                          SetCommandLineOptionWithMode_abi_cxx11_
                                    (&local_148,(gflags *)0x14f4cb,"fourth",(char *)0x2,FVar3);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_148._M_dataplus._M_p != &local_148.field_2) {
                            operator_delete(local_148._M_dataplus._M_p);
                          }
                          iVar1 = std::__cxx11::string::compare(fLS::FLAGS_test_str3_abi_cxx11_);
                          if (iVar1 == 0) {
                            SetCommandLineOptionWithMode_abi_cxx11_
                                      (&local_168,(gflags *)0x14f4cb,"fourth",(char *)0x1,FVar3);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
                              operator_delete(local_168._M_dataplus._M_p);
                            }
                            iVar1 = std::__cxx11::string::compare(fLS::FLAGS_test_str3_abi_cxx11_);
                            if (iVar1 == 0) {
                              SetCommandLineOptionWithMode_abi_cxx11_
                                        (&local_188,(gflags *)0x14f4cb,"fourth",(char *)0x0,FVar3);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                operator_delete(local_188._M_dataplus._M_p);
                              }
                              iVar1 = std::__cxx11::string::compare(fLS::FLAGS_test_str3_abi_cxx11_)
                              ;
                              if (iVar1 == 0) {
                                FlagSaver::~FlagSaver(&fs);
                                return;
                              }
                              pcVar2 = "\"fourth\"";
                              goto LAB_00120b8e;
                            }
                          }
                          pcVar2 = "\"third\"";
                        }
                        else {
                          pcVar2 = "\"second\"";
                        }
                      }
                      else {
                        pcVar2 = "\"initial\"";
                      }
LAB_00120b8e:
                      pcVar4 = "FLAGS_test_str3";
                      goto LAB_00120b9c;
                    }
                    pcVar2 = "\"fourth\"";
                  }
                  else {
                    pcVar2 = "\"third\"";
                  }
                }
                else {
                  pcVar2 = "\"extra\"";
                }
              }
              else {
                pcVar2 = "\"second\"";
              }
            }
            else {
              pcVar2 = "\"initial\"";
            }
            pcVar4 = "FLAGS_test_str2";
            goto LAB_00120b9c;
          }
        }
        pcVar2 = "\"third\"";
        goto LAB_00120ac1;
      }
    }
    pcVar2 = "\"second\"";
  }
  else {
LAB_00120a9d:
    pcVar2 = "\"initial\"";
  }
LAB_00120ac1:
  pcVar4 = "FLAGS_test_str1";
LAB_00120b9c:
  fprintf(_stderr,"Check failed: %s %s %s\n",pcVar2,"==",pcVar4);
  exit(1);
}

Assistant:

TEST(SetFlagValueTest, OrdinaryValues) {
  EXPECT_EQ("initial", FLAGS_test_str1);

  SetCommandLineOptionWithMode("test_str1", "second", SET_FLAG_IF_DEFAULT);
  EXPECT_EQ("second", FLAGS_test_str1);  // set; was default

  SetCommandLineOptionWithMode("test_str1", "third", SET_FLAG_IF_DEFAULT);
  EXPECT_EQ("second", FLAGS_test_str1);  // already set once

  FLAGS_test_str1 = "initial";
  SetCommandLineOptionWithMode("test_str1", "third", SET_FLAG_IF_DEFAULT);
  EXPECT_EQ("initial", FLAGS_test_str1);  // still already set before

  SetCommandLineOptionWithMode("test_str1", "third", SET_FLAGS_VALUE);
  EXPECT_EQ("third", FLAGS_test_str1);  // changed value

  SetCommandLineOptionWithMode("test_str1", "fourth", SET_FLAGS_DEFAULT);
  EXPECT_EQ("third", FLAGS_test_str1);
  // value not changed (already set before)

  EXPECT_EQ("initial", FLAGS_test_str2);

  SetCommandLineOptionWithMode("test_str2", "second", SET_FLAGS_DEFAULT);
  EXPECT_EQ("second", FLAGS_test_str2);  // changed (was default)

  FLAGS_test_str2 = "extra";
  EXPECT_EQ("extra", FLAGS_test_str2);

  FLAGS_test_str2 = "second";
  SetCommandLineOptionWithMode("test_str2", "third", SET_FLAGS_DEFAULT);
  EXPECT_EQ("third", FLAGS_test_str2);  // still changed (was equal to default)

  SetCommandLineOptionWithMode("test_str2", "fourth", SET_FLAG_IF_DEFAULT);
  EXPECT_EQ("fourth", FLAGS_test_str2);  // changed (was default)

  EXPECT_EQ("initial", FLAGS_test_str3);

  SetCommandLineOptionWithMode("test_str3", "second", SET_FLAGS_DEFAULT);
  EXPECT_EQ("second", FLAGS_test_str3);  // changed

  FLAGS_test_str3 = "third";
  SetCommandLineOptionWithMode("test_str3", "fourth", SET_FLAGS_DEFAULT);
  EXPECT_EQ("third", FLAGS_test_str3);  // not changed (was set)

  SetCommandLineOptionWithMode("test_str3", "fourth", SET_FLAG_IF_DEFAULT);
  EXPECT_EQ("third", FLAGS_test_str3);  // not changed (was set)

  SetCommandLineOptionWithMode("test_str3", "fourth", SET_FLAGS_VALUE);
  EXPECT_EQ("fourth", FLAGS_test_str3);  // changed value
}